

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::RsCaseItemSyntax*>::
emplace_back<slang::syntax::RsCaseItemSyntax*>
          (SmallVectorBase<slang::syntax::RsCaseItemSyntax*> *this,RsCaseItemSyntax **args)

{
  iterator ppRVar1;
  RsCaseItemSyntax **args_local;
  SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppRVar1 = SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *)
                 emplaceRealloc<slang::syntax::RsCaseItemSyntax*>(this,ppRVar1,args);
  }
  else {
    ppRVar1 = SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *)this);
    *ppRVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *)
                 SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::back
                           ((SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }